

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestMutualRecursionA_SubGroup::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestMutualRecursionA_SubGroup **v1;
  TestMutualRecursionA_SubGroup **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestMutualRecursionA_SubMessage *pTVar4;
  TestAllTypes *pTVar5;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  uint local_88;
  uint32_t cached_has_bits;
  LogMessage local_78;
  Voidify local_61;
  TestMutualRecursionA_SubGroup *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestMutualRecursionA_SubGroup *from;
  TestMutualRecursionA_SubGroup *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_20;
  void *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestMutualRecursionA_SubGroup *)to_msg;
  _this = (TestMutualRecursionA_SubGroup *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_60 = (TestMutualRecursionA_SubGroup *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestMutualRecursionA_SubGroup_const*>(&local_60);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestMutualRecursionA_SubGroup*>(&from);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestMutualRecursionA_SubGroup_const*,edition_unittest::TestMutualRecursionA_SubGroup*>
                       (v1,v2,"&from != _this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x566b,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_88 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_88 = *puVar3;
  if ((local_88 & 3) != 0) {
    if ((local_88 & 1) != 0) {
      local_a1 = 0;
      if ((arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x5672,"from._impl_.sub_message_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      if ((from->field_0)._impl_.sub_message_ == (TestMutualRecursionA_SubMessage *)0x0) {
        local_18 = (void *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i;
        local_10 = absl_log_internal_check_op_result;
        pTVar4 = (TestMutualRecursionA_SubMessage *)
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestMutualRecursionA_SubMessage>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.sub_message_ = pTVar4;
      }
      else {
        TestMutualRecursionA_SubMessage::MergeFrom
                  ((from->field_0)._impl_.sub_message_,
                   (TestMutualRecursionA_SubMessage *)
                   (arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i);
      }
    }
    if ((local_88 & 2) != 0) {
      if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x567a,"from._impl_.not_in_this_scc_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      if ((from->field_0)._impl_.not_in_this_scc_ == (TestAllTypes *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
        local_20 = absl_log_internal_check_op_result;
        pTVar5 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.not_in_this_scc_ = pTVar5;
      }
      else {
        edition_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.not_in_this_scc_,
                   (TestAllTypes *)(arena->impl_).head_._M_b._M_p);
      }
    }
  }
  uVar1 = local_88;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestMutualRecursionA_SubGroup::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMutualRecursionA_SubGroup*>(&to_msg);
  auto& from = static_cast<const TestMutualRecursionA_SubGroup&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestMutualRecursionA.SubGroup)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.sub_message_ != nullptr);
      if (_this->_impl_.sub_message_ == nullptr) {
        _this->_impl_.sub_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.sub_message_);
      } else {
        _this->_impl_.sub_message_->MergeFrom(*from._impl_.sub_message_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.not_in_this_scc_ != nullptr);
      if (_this->_impl_.not_in_this_scc_ == nullptr) {
        _this->_impl_.not_in_this_scc_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.not_in_this_scc_);
      } else {
        _this->_impl_.not_in_this_scc_->MergeFrom(*from._impl_.not_in_this_scc_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}